

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O0

void CRYPTO_poly1305_init(poly1305_state *state,uint8_t *key)

{
  uint32_t uVar1;
  poly1305_state_internal *ppVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t t1;
  uint64_t t0;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  poly1305_power *p;
  poly1305_state_internal *st;
  uint8_t *key_local;
  poly1305_state *state_local;
  
  ppVar2 = poly1305_aligned_state(state);
  uVar3 = CRYPTO_load_u64_le(key);
  uVar4 = CRYPTO_load_u64_le(key + 8);
  uVar5 = (uVar3 >> 0x2c | uVar4 << 0x14) & 0xfffffc0ffff;
  uVar6 = uVar4 >> 0x18 & 0xffffffc0f;
  r1._0_4_ = (uint32_t)(uVar3 & 0xffc0fffffff);
  ppVar2->P[1].R20.d[1] = (uint32_t)r1;
  r1._4_4_ = (uint32_t)((uVar3 & 0xffc0fffffff) >> 0x20);
  ppVar2->P[1].R20.d[3] = r1._4_4_;
  r2._0_4_ = (uint32_t)uVar5;
  ppVar2->P[1].R21.d[1] = (uint32_t)r2;
  r2._4_4_ = (uint32_t)(uVar5 >> 0x20);
  ppVar2->P[1].R21.d[3] = r2._4_4_;
  t0._0_4_ = (uint32_t)uVar6;
  ppVar2->P[1].R22.d[1] = (uint32_t)t0;
  t0._4_4_ = (uint32_t)(uVar6 >> 0x20);
  ppVar2->P[1].R22.d[3] = t0._4_4_;
  uVar1 = CRYPTO_load_u32_le(key + 0x10);
  ppVar2->P[1].R23.d[1] = uVar1;
  uVar1 = CRYPTO_load_u32_le(key + 0x14);
  ppVar2->P[1].R23.d[3] = uVar1;
  uVar1 = CRYPTO_load_u32_le(key + 0x18);
  ppVar2->P[1].R24.d[1] = uVar1;
  uVar1 = CRYPTO_load_u32_le(key + 0x1c);
  ppVar2->P[1].R24.d[3] = uVar1;
  (ppVar2->field_1).H[0][0] = 0;
  (ppVar2->field_1).H[0][1] = 0;
  (ppVar2->field_1).H[1][0] = 0;
  (ppVar2->field_1).H[1][1] = 0;
  (ppVar2->field_1).H[2][0] = 0;
  (ppVar2->field_1).H[2][1] = 0;
  (ppVar2->field_1).H[3][0] = 0;
  (ppVar2->field_1).H[3][1] = 0;
  (ppVar2->field_1).H[4][0] = 0;
  (ppVar2->field_1).H[4][1] = 0;
  ppVar2->started = 0;
  ppVar2->leftover = 0;
  return;
}

Assistant:

void CRYPTO_poly1305_init(poly1305_state *state, const uint8_t key[32]) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  poly1305_power *p;
  uint64_t r0, r1, r2;
  uint64_t t0, t1;

  // clamp key
  t0 = CRYPTO_load_u64_le(key + 0);
  t1 = CRYPTO_load_u64_le(key + 8);
  r0 = t0 & 0xffc0fffffff;
  t0 >>= 44;
  t0 |= t1 << 20;
  r1 = t0 & 0xfffffc0ffff;
  t1 >>= 24;
  r2 = t1 & 0x00ffffffc0f;

  // store r in un-used space of st->P[1]
  p = &st->P[1];
  p->R20.d[1] = (uint32_t)(r0);
  p->R20.d[3] = (uint32_t)(r0 >> 32);
  p->R21.d[1] = (uint32_t)(r1);
  p->R21.d[3] = (uint32_t)(r1 >> 32);
  p->R22.d[1] = (uint32_t)(r2);
  p->R22.d[3] = (uint32_t)(r2 >> 32);

  // store pad
  p->R23.d[1] = CRYPTO_load_u32_le(key + 16);
  p->R23.d[3] = CRYPTO_load_u32_le(key + 20);
  p->R24.d[1] = CRYPTO_load_u32_le(key + 24);
  p->R24.d[3] = CRYPTO_load_u32_le(key + 28);

  // H = 0
  st->H[0] = _mm_setzero_si128();
  st->H[1] = _mm_setzero_si128();
  st->H[2] = _mm_setzero_si128();
  st->H[3] = _mm_setzero_si128();
  st->H[4] = _mm_setzero_si128();

  st->started = 0;
  st->leftover = 0;
}